

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_scgi_module.c
# Opt level: O0

ngx_int_t ngx_http_scgi_reinit_request(ngx_http_request_t *r)

{
  void *pvVar1;
  ngx_http_status_t *status;
  ngx_http_request_t *r_local;
  
  pvVar1 = r->ctx[ngx_http_scgi_module.ctx_index];
  if (pvVar1 != (void *)0x0) {
    *(undefined8 *)((long)pvVar1 + 8) = 0;
    *(undefined8 *)((long)pvVar1 + 0x10) = 0;
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    r->upstream->process_header = ngx_http_scgi_process_status_line;
    r->state = 0;
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_scgi_reinit_request(ngx_http_request_t *r)
{
    ngx_http_status_t  *status;

    status = ngx_http_get_module_ctx(r, ngx_http_scgi_module);

    if (status == NULL) {
        return NGX_OK;
    }

    status->code = 0;
    status->count = 0;
    status->start = NULL;
    status->end = NULL;

    r->upstream->process_header = ngx_http_scgi_process_status_line;
    r->state = 0;

    return NGX_OK;
}